

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

ValueInfo * __thiscall
GlobOptBlockData::MergeValueInfo
          (GlobOptBlockData *this,Value *toDataVal,Value *fromDataVal,Sym *fromDataSym,
          bool isLoopBackEdge,bool sameValueNumber,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge)

{
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  Bits bits;
  ValueInfo *pVVar5;
  undefined4 *puVar6;
  JsTypeValueInfo *pJVar7;
  JsTypeValueInfo *fromValueInfo;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_00;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar8;
  ArrayValueInfo *toDataValueInfo_00;
  ArrayValueInfo *fromDataValueInfo_00;
  bool local_b9;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_6a;
  ValueInfo *pVStack_68;
  ValueType newValueType;
  ValueInfo *fromDataValueInfo;
  ValueInfo *toDataValueInfo;
  bool sameValueNumber_local;
  bool isLoopBackEdge_local;
  Sym *fromDataSym_local;
  Value *fromDataVal_local;
  Value *toDataVal_local;
  GlobOptBlockData *this_local;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_24;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_22;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_20;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1e;
  ValueType merged;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a;
  
  pVVar5 = ::Value::GetValueInfo(toDataVal);
  pVStack_68 = ::Value::GetValueInfo(fromDataVal);
  bVar3 = ValueInfo::IsJsType(pVVar5);
  if ((bVar3) || (bVar3 = ValueInfo::IsJsType(pVStack_68), bVar3)) {
    bVar3 = ValueInfo::IsJsType(pVVar5);
    if ((!bVar3) || (bVar3 = ValueInfo::IsJsType(pVStack_68), !bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x3b0,"(toDataValueInfo->IsJsType() && fromDataValueInfo->IsJsType())",
                         "toDataValueInfo->IsJsType() && fromDataValueInfo->IsJsType()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pJVar7 = ValueInfo::AsJsType(pVVar5);
    fromValueInfo = ValueInfo::AsJsType(pVStack_68);
    pJVar7 = MergeJsTypeValueInfo(this,pJVar7,fromValueInfo,isLoopBackEdge,sameValueNumber);
    return &pJVar7->super_ValueInfo;
  }
  if (pVVar5 == pVStack_68) {
    return pVVar5;
  }
  this_00 = &ValueInfo::Type(pVVar5)->field_0;
  paVar8 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
           ValueInfo::Type(pVStack_68);
  aVar1.field_0 = *paVar8;
  merged = ValueType::Verify((ValueType)
                             *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&this_00->field_0);
  local_1e.field_0 = aVar1.field_0;
  local_20.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::Verify(aVar1.field_0);
  local_22.field_0 = aVar1.field_0;
  bVar3 = ValueType::operator==((ValueType *)&this_00->field_0,(ValueType)aVar1.field_0);
  if (bVar3) {
    local_a.field_0 = this_00->field_0;
  }
  else {
    bits = operator|(this_00->bits,aVar1.bits);
    ValueType::ValueType((ValueType *)&local_24.field_0,bits);
    bVar3 = ValueType::OneOn((ValueType *)&local_24.field_0,Object);
    if (bVar3) {
      local_a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::MergeWithObject((ValueType *)&this_00->field_0,aVar1.field_0);
    }
    else {
      local_a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::Verify(local_24.field_0);
    }
  }
  local_6a.field_0 = local_a.field_0;
  bVar3 = ValueType::IsLikelyInt((ValueType *)&local_6a.field_0);
  if (bVar3) {
    pVVar5 = ValueInfo::MergeLikelyIntValueInfo
                       (this->globOpt->alloc,toDataVal,fromDataVal,(ValueType)local_6a.field_0);
    return pVVar5;
  }
  bVar3 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_6a.field_0);
  if (!bVar3) {
    pVVar5 = ValueInfo::New(this->globOpt->alloc,(ValueType)local_6a.field_0);
    return pVVar5;
  }
  bVar3 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)&local_6a.field_0);
  if (((bVar3) &&
      (bVar3 = ValueType::IsLikelyArrayOrObjectWithArray(&pVVar5->super_ValueType), bVar3)) &&
     (bVar3 = ValueType::IsLikelyArrayOrObjectWithArray(&pVStack_68->super_ValueType), bVar3)) {
    bVar3 = ValueType::HasNoMissingValues(&pVVar5->super_ValueType);
    local_b9 = false;
    if (bVar3) {
      local_b9 = ValueType::HasNoMissingValues(&pVStack_68->super_ValueType);
    }
    local_6a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_6a.field_0,local_b9);
    bVar3 = ValueType::HasIntElements(&pVVar5->super_ValueType);
    bVar4 = ValueType::HasIntElements(&pVStack_68->super_ValueType);
    if (bVar3 == bVar4) {
      bVar3 = ValueType::HasFloatElements(&pVVar5->super_ValueType);
      bVar4 = ValueType::HasFloatElements(&pVStack_68->super_ValueType);
      if (bVar3 == bVar4) goto LAB_005f2fc9;
    }
    local_6a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)&local_6a.field_0);
  }
LAB_005f2fc9:
  bVar3 = ValueType::IsObject((ValueType *)&local_6a.field_0);
  if (((bVar3) && (bVar3 = ValueInfo::IsArrayValueInfo(pVVar5), bVar3)) &&
     (bVar3 = ValueInfo::IsArrayValueInfo(pVStack_68), aVar1 = local_6a, bVar3)) {
    toDataValueInfo_00 = ValueInfo::AsArrayValueInfo(pVVar5);
    fromDataValueInfo_00 = ValueInfo::AsArrayValueInfo(pVStack_68);
    this_local = (GlobOptBlockData *)
                 MergeArrayValueInfo(this,(ValueType)aVar1.field_0,toDataValueInfo_00,
                                     fromDataValueInfo_00,fromDataSym,symsRequiringCompensation,
                                     symsCreatedForMerge,isLoopBackEdge);
  }
  else {
    this_local = (GlobOptBlockData *)
                 ValueInfo::New(this->globOpt->alloc,(ValueType)local_6a.field_0);
  }
  return (ValueInfo *)this_local;
}

Assistant:

ValueInfo *
GlobOptBlockData::MergeValueInfo(
    Value *toDataVal,
    Value *fromDataVal,
    Sym *fromDataSym,
    bool isLoopBackEdge,
    bool sameValueNumber,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge)
{
    ValueInfo *const toDataValueInfo = toDataVal->GetValueInfo();
    ValueInfo *const fromDataValueInfo = fromDataVal->GetValueInfo();

    if (toDataValueInfo->IsJsType() || fromDataValueInfo->IsJsType())
    {
        Assert(toDataValueInfo->IsJsType() && fromDataValueInfo->IsJsType());
        return this->MergeJsTypeValueInfo(toDataValueInfo->AsJsType(), fromDataValueInfo->AsJsType(), isLoopBackEdge, sameValueNumber);
    }

    // Same value
    if (toDataValueInfo == fromDataValueInfo)
    {
        return toDataValueInfo;
    }

    ValueType newValueType(toDataValueInfo->Type().Merge(fromDataValueInfo->Type()));
    if (newValueType.IsLikelyInt())
    {
        return ValueInfo::MergeLikelyIntValueInfo(this->globOpt->alloc, toDataVal, fromDataVal, newValueType);
    }
    if(newValueType.IsLikelyAnyOptimizedArray())
    {
        if(newValueType.IsLikelyArrayOrObjectWithArray() &&
            toDataValueInfo->IsLikelyArrayOrObjectWithArray() &&
            fromDataValueInfo->IsLikelyArrayOrObjectWithArray())
        {
            // Value type merge for missing values is aggressive by default (for profile data) - if either side likely has no
            // missing values, then the merged value type also likely has no missing values. This is because arrays often start
            // off having missing values but are eventually filled up. In GlobOpt however, we need to be conservative because
            // the existence of a value type that likely has missing values indicates that it is more likely for it to have
            // missing values than not. Also, StElems that are likely to create missing values are tracked in profile data and
            // will update value types to say they are now likely to have missing values, and that needs to be propagated
            // conservatively.
            newValueType =
                newValueType.SetHasNoMissingValues(
                    toDataValueInfo->HasNoMissingValues() && fromDataValueInfo->HasNoMissingValues());

            if(toDataValueInfo->HasIntElements() != fromDataValueInfo->HasIntElements() ||
                toDataValueInfo->HasFloatElements() != fromDataValueInfo->HasFloatElements())
            {
                // When merging arrays with different native storage types, make the merged value type a likely version to force
                // array checks to be done again and cause a conversion and/or bailout as necessary
                newValueType = newValueType.ToLikely();
            }
        }

        if(!(newValueType.IsObject() && toDataValueInfo->IsArrayValueInfo() && fromDataValueInfo->IsArrayValueInfo()))
        {
            return ValueInfo::New(this->globOpt->alloc, newValueType);
        }

        return
            this->MergeArrayValueInfo(
                newValueType,
                toDataValueInfo->AsArrayValueInfo(),
                fromDataValueInfo->AsArrayValueInfo(),
                fromDataSym,
                symsRequiringCompensation,
                symsCreatedForMerge,
                isLoopBackEdge);
    }

    // Consider: If both values are VarConstantValueInfo with the same value, we could
    // merge them preserving the value.
    return ValueInfo::New(this->globOpt->alloc, newValueType);
}